

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUnreach.c
# Opt level: O3

DdNode * Abc_NtkComputeUnreachable
                   (DdManager *dd,Abc_Ntk_t *pNtk,DdNode *bTrans,DdNode *bInitial,int fVerbose)

{
  double dVar1;
  int iVar2;
  DdNode *n;
  DdNode *pDVar3;
  DdNode *n_00;
  DdNode *g;
  uint uVar4;
  
  Cudd_Ref(bInitial);
  Cudd_Ref(bInitial);
  Cudd_Ref(bTrans);
  n = Extra_bddComputeRangeCube(dd,pNtk->vPis->nSize,pNtk->vCis->nSize);
  Cudd_Ref(n);
  uVar4 = 1;
  g = bInitial;
  while( true ) {
    pDVar3 = Cudd_bddAndAbstract(dd,bTrans,bInitial,n);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,bInitial);
    n_00 = Cudd_bddVarMap(dd,pDVar3);
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(dd,pDVar3);
    iVar2 = Cudd_bddLeq(dd,n_00,g);
    if (iVar2 != 0) break;
    bInitial = Cudd_bddAnd(dd,n_00,(DdNode *)((ulong)g ^ 1));
    Cudd_Ref(bInitial);
    pDVar3 = Cudd_bddOr(dd,g,n_00);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,g);
    Cudd_RecursiveDeref(dd,n_00);
    uVar4 = uVar4 + 1;
    g = pDVar3;
  }
  Cudd_RecursiveDeref(dd,bTrans);
  Cudd_RecursiveDeref(dd,n);
  Cudd_RecursiveDeref(dd,n_00);
  if (fVerbose != 0) {
    dVar1 = Cudd_CountMinterm(dd,g,pNtk->nObjCounts[8]);
    fprintf(_stdout,"Reachability analysis completed in %d iterations.\n",(ulong)uVar4);
    fprintf(_stdout,"The number of minterms in the reachable state set = %d. (%6.2f %%)\n",
            SUB84(((double)(int)dVar1 * 100.0) / (double)(1 << ((byte)pNtk->nObjCounts[8] & 0x1f)),0
                 ),(ulong)(uint)(int)dVar1);
  }
  Cudd_Deref(g);
  return (DdNode *)((ulong)g ^ 1);
}

Assistant:

DdNode * Abc_NtkComputeUnreachable( DdManager * dd, Abc_Ntk_t * pNtk, DdNode * bTrans, DdNode * bInitial, int fVerbose )
{
    DdNode * bRelation, * bReached, * bCubeCs;
    DdNode * bCurrent, * bNext, * bTemp;
    int nIters, nMints;

    // perform reachability analisys
    bCurrent  = bInitial;   Cudd_Ref( bCurrent );
    bReached  = bInitial;   Cudd_Ref( bReached );
    bRelation = bTrans;     Cudd_Ref( bRelation );
    bCubeCs   = Extra_bddComputeRangeCube( dd, Abc_NtkPiNum(pNtk), Abc_NtkCiNum(pNtk) );    Cudd_Ref( bCubeCs );
    for ( nIters = 1; ; nIters++ )
    {
        // compute the next states
        bNext = Cudd_bddAndAbstract( dd, bRelation, bCurrent, bCubeCs );  Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bCurrent );
        // remap these states into the current state vars
        bNext = Cudd_bddVarMap( dd, bTemp = bNext );                      Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bTemp );
        // check if there are any new states
        if ( Cudd_bddLeq( dd, bNext, bReached ) )
            break;
        // get the new states
        bCurrent = Cudd_bddAnd( dd, bNext, Cudd_Not(bReached) );          Cudd_Ref( bCurrent );
        // minimize the new states with the reached states
//        bCurrent = Cudd_bddConstrain( dd, bTemp = bCurrent, Cudd_Not(bReached) ); Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( dd, bTemp );
        // add to the reached states
        bReached = Cudd_bddOr( dd, bTemp = bReached, bNext );             Cudd_Ref( bReached );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bNext );
        // minimize the transition relation
//        bRelation = Cudd_bddConstrain( dd, bTemp = bRelation, Cudd_Not(bReached) ); Cudd_Ref( bRelation );
//        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_RecursiveDeref( dd, bRelation );
    Cudd_RecursiveDeref( dd, bCubeCs );
    Cudd_RecursiveDeref( dd, bNext );
    // report the stats
    if ( fVerbose )
    {
        nMints = (int)Cudd_CountMinterm(dd, bReached, Abc_NtkLatchNum(pNtk) );
        fprintf( stdout, "Reachability analysis completed in %d iterations.\n", nIters );
        fprintf( stdout, "The number of minterms in the reachable state set = %d. (%6.2f %%)\n", nMints, 100.0*nMints/(1<<Abc_NtkLatchNum(pNtk)) );
    }
//ABC_PRB( dd, bReached );
    Cudd_Deref( bReached );
    return Cudd_Not( bReached );
}